

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O1

void start_pass_1_quant(j_decompress_ptr cinfo,boolean is_pre_scan)

{
  J_DITHER_MODE JVar1;
  int iVar2;
  JDIMENSION JVar3;
  jpeg_color_quantizer *pjVar4;
  jpeg_error_mgr *pjVar5;
  code *pcVar6;
  long lVar7;
  _func_void_j_decompress_ptr *p_Var8;
  UINT8 (*paUVar9) [16];
  _func_void_j_decompress_ptr *p_Var10;
  long lVar11;
  long lVar12;
  
  pjVar4 = cinfo->cquantize;
  cinfo->colormap = (JSAMPARRAY)pjVar4[1].start_pass;
  cinfo->actual_number_of_colors = *(int *)&pjVar4[1].color_quantize;
  JVar1 = cinfo->dither_mode;
  if (JVar1 == JDITHER_FS) {
    pjVar4->color_quantize = quantize_fs_dither;
    *(undefined4 *)&pjVar4[4].finish_pass = 0;
    if (pjVar4[3].finish_pass == (_func_void_j_decompress_ptr *)0x0) {
      alloc_fs_workspace(cinfo);
    }
    if (0 < cinfo->out_color_components) {
      JVar3 = cinfo->output_width;
      lVar12 = 0;
      do {
        memset((&pjVar4[3].finish_pass)[lVar12],0,(ulong)(JVar3 + 2) * 2);
        lVar12 = lVar12 + 1;
      } while (lVar12 < cinfo->out_color_components);
    }
  }
  else if (JVar1 == JDITHER_ORDERED) {
    pcVar6 = quantize_ord_dither;
    if (cinfo->out_color_components == 3) {
      pcVar6 = quantize3_ord_dither;
    }
    pjVar4->color_quantize = pcVar6;
    *(undefined4 *)((long)&pjVar4[2].color_quantize + 4) = 0;
    if (*(int *)&pjVar4[1].new_color_map == 0) {
      create_colorindex(cinfo);
    }
    if ((pjVar4[2].finish_pass == (_func_void_j_decompress_ptr *)0x0) &&
       (0 < cinfo->out_color_components)) {
      pjVar4 = cinfo->cquantize;
      lVar12 = 0;
      do {
        iVar2 = *(int *)((long)&pjVar4[1].new_color_map + lVar12 * 4 + 4);
        if (lVar12 != 0) {
          lVar7 = 0;
          do {
            if (iVar2 == *(int *)((long)&pjVar4[1].new_color_map + lVar7 * 4 + 4)) {
              p_Var8 = (&pjVar4[2].finish_pass)[lVar7];
              goto LAB_0027f659;
            }
            lVar7 = lVar7 + 1;
          } while (lVar12 != lVar7);
        }
        p_Var8 = (_func_void_j_decompress_ptr *)0x0;
LAB_0027f659:
        if (p_Var8 == (_func_void_j_decompress_ptr *)0x0) {
          p_Var8 = (_func_void_j_decompress_ptr *)
                   (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x400);
          paUVar9 = base_dither_matrix;
          lVar7 = 0;
          p_Var10 = p_Var8;
          do {
            lVar11 = 0;
            do {
              *(int *)(p_Var10 + lVar11 * 4) =
                   (int)((long)((0xff - (ulong)((uint)(*paUVar9)[lVar11] * 2)) * 0xff) /
                        ((long)iVar2 * 0x200 + -0x200));
              lVar11 = lVar11 + 1;
            } while (lVar11 != 0x10);
            lVar7 = lVar7 + 1;
            p_Var10 = p_Var10 + 0x40;
            paUVar9 = paUVar9 + 1;
          } while (lVar7 != 0x10);
        }
        (&pjVar4[2].finish_pass)[lVar12] = p_Var8;
        lVar12 = lVar12 + 1;
      } while (lVar12 < cinfo->out_color_components);
    }
  }
  else {
    if (JVar1 != JDITHER_NONE) {
      pjVar5 = cinfo->err;
      pjVar5->msg_code = 0x31;
      (*pjVar5->error_exit)((j_common_ptr)cinfo);
      return;
    }
    if (cinfo->out_color_components == 3) {
      pcVar6 = color_quantize3;
    }
    else {
      pcVar6 = color_quantize;
    }
    pjVar4->color_quantize = pcVar6;
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass_1_quant (j_decompress_ptr cinfo, boolean is_pre_scan)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  size_t arraysize;
  int i;

  /* Install my colormap. */
  cinfo->colormap = cquantize->sv_colormap;
  cinfo->actual_number_of_colors = cquantize->sv_actual;

  /* Initialize for desired dithering mode. */
  switch (cinfo->dither_mode) {
  case JDITHER_NONE:
    if (cinfo->out_color_components == 3)
      cquantize->pub.color_quantize = color_quantize3;
    else
      cquantize->pub.color_quantize = color_quantize;
    break;
  case JDITHER_ORDERED:
    if (cinfo->out_color_components == 3)
      cquantize->pub.color_quantize = quantize3_ord_dither;
    else
      cquantize->pub.color_quantize = quantize_ord_dither;
    cquantize->row_index = 0;	/* initialize state for ordered dither */
    /* If user changed to ordered dither from another mode,
     * we must recreate the color index table with padding.
     * This will cost extra space, but probably isn't very likely.
     */
    if (! cquantize->is_padded)
      create_colorindex(cinfo);
    /* Create ordered-dither tables if we didn't already. */
    if (cquantize->odither[0] == NULL)
      create_odither_tables(cinfo);
    break;
  case JDITHER_FS:
    cquantize->pub.color_quantize = quantize_fs_dither;
    cquantize->on_odd_row = FALSE; /* initialize state for F-S dither */
    /* Allocate Floyd-Steinberg workspace if didn't already. */
    if (cquantize->fserrors[0] == NULL)
      alloc_fs_workspace(cinfo);
    /* Initialize the propagated errors to zero. */
    arraysize = (size_t) ((cinfo->output_width + 2) * SIZEOF(FSERROR));
    for (i = 0; i < cinfo->out_color_components; i++)
      FMEMZERO((void FAR *) cquantize->fserrors[i], arraysize);
    break;
  default:
    ERREXIT(cinfo, JERR_NOT_COMPILED);
    break;
  }
}